

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  pointer pSVar3;
  undefined4 in_EAX;
  int iVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  bool bVar7;
  long lVar8;
  undefined8 uStack_28;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uStack_28._0_4_ = in_EAX;
  iVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    if (0 < iVar4) {
      lVar8 = 0;
      do {
        uVar2 = *(uint *)((long)*inputs + lVar8 * 4);
        bVar7 = (uVar2 & 0x7fffff) != 0 && (~uVar2 & 0x7f800000) == 0;
        if (*(uint *)((long)*outputs + lVar8 * 4) != (uint)bVar7) {
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          uStack_28 = (ulong)CONCAT14(bVar7,(undefined4)uStack_28);
          Functional::operator<<(poVar5,(HexBool *)((long)&uStack_28 + 4));
          return false;
        }
        lVar8 = lVar8 + 1;
      } while (iVar4 != (int)lVar8);
    }
  }
  else if (0 < iVar4) {
    lVar8 = 0;
    do {
      if (1 < *(uint *)((long)*outputs + lVar8 * 4)) {
        poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar6,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)lVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = 0 / 1",9);
        return false;
      }
      lVar8 = lVar8 + 1;
    } while (iVar4 != (int)lVar8);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
				const deUint32	ref		= tcu::Float32(in0).isNaN() ? 1u : 0u;

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else
		{
			// Value can be either 0 or 1
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int out0 = ((const int*)outputs[0])[compNdx];

				if (out0 != 0 && out0 != 1)
				{
					m_failMsg << "Expected [" << compNdx << "] = 0 / 1";
					return false;
				}
			}
		}

		return true;
	}